

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O1

int __thiscall asl::Random::init(Random *this,EVP_PKEY_CTX *ctx)

{
  byte bVar1;
  int extraout_EAX;
  int extraout_EAX_00;
  ulong s;
  long lVar2;
  timeval t;
  timeval local_28;
  
  if ((int)ctx != 0) {
    lVar2 = 0;
    gettimeofday(&local_28,(__timezone_ptr_t)0x0);
    s = local_28.tv_sec * 1000000 + local_28.tv_usec;
    bVar1 = 0x38;
    do {
      s = (~s & 0xffL << ((byte)lVar2 & 0x3f)) << (bVar1 & 0x3f) ^ s;
      lVar2 = lVar2 + 1;
      bVar1 = bVar1 - 0x10;
    } while (lVar2 != 4);
    seed(this,s);
    return extraout_EAX;
  }
  getBytes(this,0x20);
  return extraout_EAX_00;
}

Assistant:

void Random::init(bool fast)
{
	if (fast)
	{
		ULong s = (ULong)inow();
		for (int i = 0; i < (int)sizeof(s)/2; i++)
			s ^= ((s & (255ull << i)) ^ (255ull << i)) << 8 * (sizeof(s) - i - i - 1);
		seed(s);
	}
	else
		getBytes(_state, sizeof(_state));
}